

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadTypedArray(BCReaderState *s)

{
  uint uVar1;
  JSContext *ctx_00;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue obj_00;
  JSValue new_target;
  int iVar2;
  JSArrayBuffer *pJVar3;
  undefined8 *in_RDI;
  JSValue JVar4;
  JSValue JVar5;
  uint32_t idx;
  uint32_t len;
  uint32_t offset;
  JSValue args [3];
  uint8_t array_tag;
  JSValue array_buffer;
  JSValue obj;
  JSContext *ctx;
  JSValue v_1;
  JSValue v;
  BCReaderState *in_stack_fffffffffffffe58;
  JSValueUnion *pJVar6;
  JSValueUnion *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  JSValueUnion in_stack_fffffffffffffe70;
  int64_t in_stack_fffffffffffffe78;
  JSValueUnion JVar7;
  int64_t local_180;
  JSValueUnion local_158;
  JSValueUnion local_150;
  uint local_140;
  uint local_13c;
  JSValueUnion local_128 [2];
  undefined4 in_stack_fffffffffffffeec;
  JSValue *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  int64_t iVar8;
  long lVar11;
  undefined1 in_stack_ffffffffffffff30 [16];
  JSValue JVar9;
  JSValue JVar10;
  JSValueUnion local_c0;
  double local_b8;
  JSValueUnion local_90;
  double local_88;
  undefined4 uStack_6c;
  JSValueUnion local_60;
  double local_58;
  BCReaderState *in_stack_ffffffffffffffb0;
  JSValueUnion local_30;
  double local_28;
  undefined4 uStack_c;
  
  lVar11 = in_stack_ffffffffffffff30._4_8_;
  ctx_00 = (JSContext *)*in_RDI;
  iVar8 = 0;
  iVar2 = bc_get_u8(in_stack_fffffffffffffe58,(uint8_t *)0x16d683);
  if (iVar2 == 0) {
    if ((byte)((uint)in_stack_fffffffffffffefc >> 0x18) < 9) {
      iVar2 = bc_get_leb128((BCReaderState *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                            (uint32_t *)&in_stack_fffffffffffffe60->int32);
      if (iVar2 == 0) {
        iVar2 = bc_get_leb128((BCReaderState *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                              (uint32_t *)&in_stack_fffffffffffffe60->int32);
        if (iVar2 == 0) {
          uVar1 = *(uint *)(in_RDI + 8);
          iVar2 = BC_add_object_ref1(in_stack_fffffffffffffe58,(JSObject *)0x16d762);
          if (iVar2 == 0) {
            JVar5 = JS_ReadObjectRec(in_stack_ffffffffffffffb0);
            local_158 = JVar5.u;
            local_150 = (JSValueUnion)JVar5.tag;
            iVar2 = JS_IsException(JVar5);
            if (iVar2 != 0) {
              JVar5.u.ptr = (void *)(lVar11 << 0x20);
              JVar5.tag = 6;
              return JVar5;
            }
            obj_00.tag = in_stack_fffffffffffffe78;
            obj_00.u.ptr = in_stack_fffffffffffffe70.ptr;
            pJVar3 = js_get_array_buffer((JSContext *)
                                         CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68),obj_00);
            if (pJVar3 == (JSArrayBuffer *)0x0) {
              v_00.u._4_4_ = in_stack_fffffffffffffe6c;
              v_00.u.int32 = in_stack_fffffffffffffe68;
              v_00.tag = (int64_t)in_stack_fffffffffffffe70.ptr;
              JS_FreeValue((JSContext *)in_stack_fffffffffffffe60,v_00);
              JVar9.u.ptr = (void *)(lVar11 << 0x20);
              JVar9.tag = 6;
              return JVar9;
            }
            in_stack_fffffffffffffe60 = local_128;
            if ((ulong)local_13c == (long)(int)local_13c) {
              local_30._4_4_ = uStack_c;
              local_30.int32 = local_13c;
              local_28 = 0.0;
            }
            else {
              JVar5 = __JS_NewFloat64(ctx_00,(double)local_13c);
              local_60 = JVar5.u;
              local_30 = local_60;
              local_58 = (double)JVar5.tag;
              local_28 = local_58;
            }
            *in_stack_fffffffffffffe60 = local_30;
            in_stack_fffffffffffffe60[1].float64 = local_28;
            pJVar6 = (JSValueUnion *)&stack0xfffffffffffffee8;
            if ((ulong)local_140 == (long)(int)local_140) {
              local_90._4_4_ = uStack_6c;
              local_90.int32 = local_140;
              local_88 = 0.0;
            }
            else {
              JVar5 = __JS_NewFloat64(ctx_00,(double)local_140);
              local_c0 = JVar5.u;
              local_90 = local_c0;
              local_b8 = (double)JVar5.tag;
              local_88 = local_b8;
            }
            *pJVar6 = local_90;
            pJVar6[1].float64 = local_88;
            in_stack_fffffffffffffe68 = 0;
            in_stack_fffffffffffffe70.float64 = 1.48219693752374e-323;
            new_target.tag = iVar8;
            new_target.u.float64 = local_150.float64;
            JVar5 = js_typed_array_constructor
                              ((JSContext *)local_158.ptr,new_target,in_stack_fffffffffffffefc,
                               in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
            JVar7 = JVar5.u;
            local_180 = JVar5.tag;
            iVar2 = JS_IsException(JVar5);
            if (iVar2 == 0) {
              if (*(int *)((long)in_RDI + 0x34) >> 0x18 != 0) {
                ((JSValueUnion *)(in_RDI[7] + (ulong)uVar1 * 8))->ptr = (void *)JVar7;
              }
              v_01.u._4_4_ = in_stack_fffffffffffffe6c;
              v_01.u.int32 = in_stack_fffffffffffffe68;
              v_01.tag = (int64_t)in_stack_fffffffffffffe70.ptr;
              JS_FreeValue((JSContext *)in_stack_fffffffffffffe60,v_01);
              JVar10.tag = local_180;
              JVar10.u.float64 = JVar7.float64;
              return JVar10;
            }
          }
          v_02.u._4_4_ = in_stack_fffffffffffffe6c;
          v_02.u.int32 = in_stack_fffffffffffffe68;
          v_02.tag = (int64_t)in_stack_fffffffffffffe70.ptr;
          JS_FreeValue((JSContext *)in_stack_fffffffffffffe60,v_02);
          v_03.u._4_4_ = in_stack_fffffffffffffe6c;
          v_03.u.int32 = in_stack_fffffffffffffe68;
          v_03.tag = (int64_t)in_stack_fffffffffffffe70.ptr;
          JS_FreeValue((JSContext *)in_stack_fffffffffffffe60,v_03);
          JVar4.u.ptr = (void *)(lVar11 << 0x20);
          JVar4.tag = 6;
        }
        else {
          JVar4.u.ptr = (void *)(lVar11 << 0x20);
          JVar4.tag = 6;
        }
      }
      else {
        JVar4.u.ptr = (void *)(lVar11 << 0x20);
        JVar4.tag = 6;
      }
    }
    else {
      JVar4 = JS_ThrowTypeError(ctx_00,"invalid typed array");
    }
  }
  else {
    JVar4.u.ptr = (void *)(lVar11 << 0x20);
    JVar4.tag = 6;
  }
  return JVar4;
}

Assistant:

static JSValue JS_ReadTypedArray(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj = JS_UNDEFINED, array_buffer = JS_UNDEFINED;
    uint8_t array_tag;
    JSValueConst args[3];
    uint32_t offset, len, idx;
    
    if (bc_get_u8(s, &array_tag))
        return JS_EXCEPTION;
    if (array_tag >= JS_TYPED_ARRAY_COUNT)
        return JS_ThrowTypeError(ctx, "invalid typed array");
    if (bc_get_leb128(s, &len))
        return JS_EXCEPTION;
    if (bc_get_leb128(s, &offset))
        return JS_EXCEPTION;
    /* XXX: this hack could be avoided if the typed array could be
       created before the array buffer */
    idx = s->objects_count;
    if (BC_add_object_ref1(s, NULL))
        goto fail;
    array_buffer = JS_ReadObjectRec(s);
    if (JS_IsException(array_buffer))
        return JS_EXCEPTION;
    if (!js_get_array_buffer(ctx, array_buffer)) {
        JS_FreeValue(ctx, array_buffer);
        return JS_EXCEPTION;
    }
    args[0] = array_buffer;
    args[1] = JS_NewInt64(ctx, offset);
    args[2] = JS_NewInt64(ctx, len);
    obj = js_typed_array_constructor(ctx, JS_UNDEFINED,
                                     3, args,
                                     JS_CLASS_UINT8C_ARRAY + array_tag);
    if (JS_IsException(obj))
        goto fail;
    if (s->allow_reference) {
        s->objects[idx] = JS_VALUE_GET_OBJ(obj);
    }
    JS_FreeValue(ctx, array_buffer);
    return obj;
 fail:
    JS_FreeValue(ctx, array_buffer);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}